

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O1

void __thiscall spv::Function::addBlock(Function *this,Block *block)

{
  pointer *pppBVar1;
  iterator __position;
  Block *local_8;
  
  __position._M_current =
       (this->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = block;
    std::vector<spv::Block*,std::allocator<spv::Block*>>::_M_realloc_insert<spv::Block*const&>
              ((vector<spv::Block*,std::allocator<spv::Block*>> *)&this->blocks,__position,&local_8)
    ;
  }
  else {
    *__position._M_current = block;
    pppBVar1 = &(this->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  return;
}

Assistant:

void addBlock(Block* block) { blocks.push_back(block); }